

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.c
# Opt level: O2

xmlBufferAllocationScheme xmlThrDefBufferAllocScheme(xmlBufferAllocationScheme v)

{
  xmlBufferAllocationScheme xVar1;
  
  xmlMutexLock(xmlThrDefMutex);
  xVar1 = xmlBufferAllocSchemeThrDef;
  xmlBufferAllocSchemeThrDef = v;
  xmlMutexUnlock(xmlThrDefMutex);
  return xVar1;
}

Assistant:

xmlBufferAllocationScheme xmlThrDefBufferAllocScheme(xmlBufferAllocationScheme v) {
    xmlBufferAllocationScheme ret;
    xmlMutexLock(xmlThrDefMutex);
    ret = xmlBufferAllocSchemeThrDef;
    xmlBufferAllocSchemeThrDef = v;
    xmlMutexUnlock(xmlThrDefMutex);
    return ret;
}